

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_oth.cc
# Opt level: O0

void * PEM_ASN1_read_bio(undefined1 *d2i,char *name,BIO *bp,void **x,undefined1 *cb,void *u)

{
  int iVar1;
  d2i_of_void *pdVar2;
  char *ret;
  long len;
  uchar *data;
  uchar *p;
  void *u_local;
  pem_password_cb *cb_local;
  void **x_local;
  BIO *bp_local;
  char *name_local;
  d2i_of_void *d2i_local;
  
  data = (uchar *)0x0;
  len = 0;
  p = (uchar *)u;
  u_local = cb;
  cb_local = (pem_password_cb *)x;
  x_local = &bp->method;
  bp_local = (BIO *)name;
  name_local = d2i;
  iVar1 = PEM_bytes_read_bio((uchar **)&len,(long *)&ret,(char **)0x0,name,bp,cb,u);
  if (iVar1 == 0) {
    d2i_local = (d2i_of_void *)0x0;
  }
  else {
    data = (uchar *)len;
    pdVar2 = (d2i_of_void *)(*(code *)name_local)(cb_local,&data,ret);
    if (pdVar2 == (d2i_of_void *)0x0) {
      ERR_put_error(9,0,0xc,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_oth.cc"
                    ,0x29);
    }
    OPENSSL_free((void *)len);
    d2i_local = pdVar2;
  }
  return d2i_local;
}

Assistant:

void *PEM_ASN1_read_bio(d2i_of_void *d2i, const char *name, BIO *bp, void **x,
                        pem_password_cb *cb, void *u) {
  const unsigned char *p = NULL;
  unsigned char *data = NULL;
  long len;
  char *ret = NULL;

  if (!PEM_bytes_read_bio(&data, &len, NULL, name, bp, cb, u)) {
    return NULL;
  }
  p = data;
  ret = reinterpret_cast<char *>(d2i(x, &p, len));
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_ASN1_LIB);
  }
  OPENSSL_free(data);
  return ret;
}